

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O0

void __thiscall
vkt::Draw::PipelineCreateInfo::ColorBlendState::ColorBlendState
          (ColorBlendState *this,VkPipelineColorBlendStateCreateInfo *createInfo)

{
  uint uVar1;
  VkPipelineColorBlendAttachmentState *__first;
  size_type sVar2;
  reference pvVar3;
  allocator<vk::VkPipelineColorBlendAttachmentState> local_19;
  VkPipelineColorBlendStateCreateInfo *local_18;
  VkPipelineColorBlendStateCreateInfo *createInfo_local;
  ColorBlendState *this_local;
  
  __first = createInfo->pAttachments;
  uVar1 = createInfo->attachmentCount;
  local_18 = createInfo;
  createInfo_local = &this->super_VkPipelineColorBlendStateCreateInfo;
  std::allocator<vk::VkPipelineColorBlendAttachmentState>::allocator(&local_19);
  std::
  vector<vk::VkPipelineColorBlendAttachmentState,std::allocator<vk::VkPipelineColorBlendAttachmentState>>
  ::vector<vk::VkPipelineColorBlendAttachmentState_const*,void>
            ((vector<vk::VkPipelineColorBlendAttachmentState,std::allocator<vk::VkPipelineColorBlendAttachmentState>>
              *)&this->m_attachments,__first,__first + uVar1,&local_19);
  std::allocator<vk::VkPipelineColorBlendAttachmentState>::~allocator(&local_19);
  (this->super_VkPipelineColorBlendStateCreateInfo).sType = local_18->sType;
  (this->super_VkPipelineColorBlendStateCreateInfo).pNext = local_18->pNext;
  (this->super_VkPipelineColorBlendStateCreateInfo).flags = local_18->flags;
  (this->super_VkPipelineColorBlendStateCreateInfo).logicOpEnable = local_18->logicOpEnable;
  (this->super_VkPipelineColorBlendStateCreateInfo).logicOp = local_18->logicOp;
  sVar2 = std::
          vector<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
          ::size(&this->m_attachments);
  (this->super_VkPipelineColorBlendStateCreateInfo).attachmentCount = (deUint32)sVar2;
  pvVar3 = std::
           vector<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
           ::operator[](&this->m_attachments,0);
  (this->super_VkPipelineColorBlendStateCreateInfo).pAttachments = pvVar3;
  return;
}

Assistant:

PipelineCreateInfo::ColorBlendState::ColorBlendState (const vk::VkPipelineColorBlendStateCreateInfo& createInfo)
	: m_attachments (createInfo.pAttachments, createInfo.pAttachments + createInfo.attachmentCount)
{
	sType = createInfo.sType;
	pNext = createInfo.pNext;
	flags					= createInfo.flags;
	logicOpEnable			= createInfo.logicOpEnable;
	logicOp					= createInfo.logicOp;
	attachmentCount			= static_cast<deUint32>(m_attachments.size());
	pAttachments			= &m_attachments[0];
}